

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O0

size_t portability_path_join
                 (char *left_path,size_t left_path_size,char *right_path,size_t right_path_size,
                 char *join_path,size_t join_size)

{
  long lVar1;
  ulong in_RCX;
  char *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  void *in_R8;
  ulong in_R9;
  size_t trailing_size;
  size_t size;
  undefined8 local_40;
  undefined8 local_28;
  undefined8 local_8;
  
  if (((in_RDI == (void *)0x0) || (in_RDX == (char *)0x0)) || (in_R8 == (void *)0x0)) {
    local_8 = 0;
  }
  else {
    local_40 = 0;
    if (1 < in_RSI) {
      lVar1 = (long)(int)((uint)(*(char *)((long)in_RDI + (in_RSI - 2)) == '/') +
                         (uint)(*in_RDX == '/'));
      local_40 = in_RSI - lVar1;
      if (in_R9 < local_40) {
        local_40 = in_R9;
      }
      memcpy(in_R8,in_RDI,local_40);
      if (lVar1 == 0) {
        *(undefined1 *)((long)in_R8 + (local_40 - 1)) = 0x2f;
      }
    }
    if (in_RCX < 2) {
      if (in_R9 < local_40 + 1) {
        *(undefined1 *)((long)in_R8 + (local_40 - 1)) = 0;
      }
      else {
        *(undefined1 *)((long)in_R8 + local_40) = 0;
        local_40 = local_40 + 1;
      }
    }
    else {
      local_28 = in_RCX;
      if (in_R9 < local_40 + in_RCX) {
        local_28 = in_R9 - local_40;
      }
      memcpy((void *)((long)in_R8 + local_40),in_RDX,local_28);
      local_40 = local_28 + local_40;
    }
    local_8 = local_40;
  }
  return local_8;
}

Assistant:

size_t portability_path_join(const char *left_path, size_t left_path_size, const char *right_path, size_t right_path_size, char *join_path, size_t join_size)
{
	if (left_path == NULL || right_path == NULL || join_path == NULL)
	{
		return 0;
	}

	size_t size = 0;

	if (left_path_size > 1)
	{
		size_t trailing_size = PORTABILITY_PATH_SEPARATOR(left_path[left_path_size - 2]) + PORTABILITY_PATH_SEPARATOR(right_path[0]);

		size += left_path_size - trailing_size;

		if (size > join_size)
		{
			size = join_size;
		}

		memcpy(join_path, left_path, size);

		if (trailing_size == 0)
		{
			join_path[size - 1] = PORTABILITY_PATH_SEPARATOR_C;
		}
	}

	if (right_path_size > 1)
	{
		if (size + right_path_size > join_size)
		{
			right_path_size = join_size - size;
		}

		memcpy(&join_path[size], right_path, right_path_size);

		size += right_path_size;
	}
	else
	{
		if (size + 1 > join_size)
		{
			join_path[size - 1] = '\0';
		}
		else
		{
			join_path[size++] = '\0';
		}
	}

	return size;
}